

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_length_value(char **begin,char *end,length_t *length,_Bool negative)

{
  _Bool _Var1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  float value;
  float local_2c;
  char *local_28;
  
  local_2c = 0.0;
  local_28 = *begin;
  _Var1 = parse_float(&local_28,end,&local_2c);
  if (!_Var1) {
    return false;
  }
  cVar2 = '\0';
  if ((!negative) && (local_2c < 0.0)) {
    return false;
  }
  if (local_28 < end) {
    cVar2 = *local_28;
  }
  pcVar3 = local_28 + 1;
  cVar4 = '\0';
  if (pcVar3 < end) {
    cVar4 = *pcVar3;
  }
  if (cVar2 < 'i') {
    if (cVar2 == '%') {
      length->value = local_2c;
      length->type = length_type_percent;
      goto LAB_0010644a;
    }
    if (cVar2 != 'c') {
LAB_0010641a:
      length->value = local_2c;
      length->type = length_type_fixed;
      pcVar3 = local_28;
      goto LAB_0010644a;
    }
    if (cVar4 != 'm') {
      return false;
    }
    local_2c = (local_2c * 96.0) / 2.54;
  }
  else if (cVar2 == 'i') {
    if (cVar4 != 'n') {
      return false;
    }
    local_2c = local_2c * 96.0;
  }
  else if (cVar2 == 'm') {
    if (cVar4 != 'm') {
      return false;
    }
    local_2c = (local_2c * 96.0) / 25.4;
  }
  else {
    if (cVar2 != 'p') goto LAB_0010641a;
    if (cVar4 != 'x') {
      if (cVar4 == 't') {
        local_2c = (local_2c * 96.0) / 72.0;
      }
      else {
        if (cVar4 != 'c') {
          return false;
        }
        local_2c = (local_2c * 96.0) / 6.0;
      }
    }
  }
  length->value = local_2c;
  length->type = length_type_fixed;
  pcVar3 = local_28 + 2;
LAB_0010644a:
  *begin = pcVar3;
  return true;
}

Assistant:

static bool parse_length_value(const char** begin, const char* end, length_t* length, bool negative)
{
    float value = 0;
    const char* it = *begin;
    if(!parse_float(&it, end, &value))
        return false;
    if(!negative && value < 0.f) {
        return false;
    }

    char units[2] = {0, 0};
    if(it + 0 < end)
        units[0] = it[0];
    if(it + 1 < end) {
        units[1] = it[1];
    }

    static const float dpi = 96.f;
    switch(units[0]) {
    case '%':
        length->value = value;
        length->type = length_type_percent;
        it += 1;
        break;
    case 'p':
        if(units[1] == 'x')
            length->value = value;
        else if(units[1] == 'c')
            length->value = value * dpi / 6.f;
        else if(units[1] == 't')
            length->value = value * dpi / 72.f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'i':
        if(units[1] == 'n')
            length->value = value * dpi;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'c':
        if(units[1] == 'm')
            length->value = value * dpi / 2.54f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'm':
        if(units[1] == 'm')
            length->value = value * dpi / 25.4f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    default:
        length->value = value;
        length->type = length_type_fixed;
        break;
    }

    *begin = it;
    return true;
}